

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

bool leveldb::GetVarint64(Slice *input,uint64_t *value)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  Slice local_48;
  char *local_38;
  char *q;
  char *limit;
  char *p;
  uint64_t *value_local;
  Slice *input_local;
  
  p = (char *)value;
  value_local = (uint64_t *)input;
  pcVar1 = Slice::data(input);
  limit = pcVar1;
  sVar2 = Slice::size((Slice *)value_local);
  q = pcVar1 + sVar2;
  local_38 = GetVarint64Ptr(limit,q,(uint64_t *)p);
  bVar3 = local_38 != (char *)0x0;
  if (bVar3) {
    Slice::Slice(&local_48,local_38,(long)q - (long)local_38);
    *value_local = (uint64_t)local_48.data_;
    value_local[1] = local_48.size_;
  }
  return bVar3;
}

Assistant:

bool GetVarint64(Slice* input, uint64_t* value) {
  const char* p = input->data();
  const char* limit = p + input->size();
  const char* q = GetVarint64Ptr(p, limit, value);
  if (q == nullptr) {
    return false;
  } else {
    *input = Slice(q, limit - q);
    return true;
  }
}